

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O3

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getUwa
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          UnificationWithAbstraction uwa,bool fixedPointIteration)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  undefined7 in_register_00000081;
  undefined1 local_70 [16];
  AbstractingUnifier local_60;
  
  local_70._8_8_ = this;
  Kernel::AbstractingUnifier::AbstractingUnifier
            (&local_60,
             (AbstractionOracle)
             (UnificationWithAbstraction)CONCAT71(in_register_00000081,fixedPointIteration));
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
            ((TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)local_70,t,SUB41(uwa,0),
             (AbstractingUnifier *)0x1,(AbstractionOracle)(UnificationWithAbstraction)&local_60,
             fixedPointIteration);
  pp_Var2 = (_func_int **)
            Lib::FixedSizeAllocator<24UL>::alloc
                      ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  uVar1 = local_70._8_8_;
  if ((_func_int **)local_70._0_8_ == (_func_int **)0x0) {
    *pp_Var2 = (_func_int *)&PTR__ProxyIterator_00b2a348;
    pp_Var2[2] = (_func_int *)0x0;
    ((TermIndexingStructure<Inferences::ALASCA::Demodulation::Lhs> *)local_70._8_8_)->
    _vptr_TermIndexingStructure = pp_Var2;
    *(undefined4 *)(pp_Var2 + 1) = 1;
  }
  else {
    *(int *)(local_70._0_8_ + 8) = *(int *)(local_70._0_8_ + 8) + 1;
    *(undefined4 *)(pp_Var2 + 1) = 0;
    *pp_Var2 = (_func_int *)&PTR__ProxyIterator_00b2a348;
    pp_Var2[2] = (_func_int *)local_70._0_8_;
    *(int *)(local_70._0_8_ + 8) = *(int *)(local_70._0_8_ + 8) + 1;
    ((TermIndexingStructure<Inferences::ALASCA::Demodulation::Lhs> *)local_70._8_8_)->
    _vptr_TermIndexingStructure = pp_Var2;
    *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
    pp_Var2 = (_func_int **)(local_70._0_8_ + 8);
    *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
    if (*(int *)pp_Var2 == 0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 8))();
    }
  }
  if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
    pp_Var2 = (_func_int **)(local_70._0_8_ + 8);
    *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
    if (*(int *)pp_Var2 == 0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 8))();
    }
  }
  Lib::Recycled<Kernel::UnificationConstraintStack,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_60._constr);
  Lib::Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (&local_60._subs);
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
            *)uVar1;
}

Assistant:

VirtualIterator<QueryRes<AbstractingUnifier*, LeafData>> getUwa(TypedTermList t, Options::UnificationWithAbstraction uwa, bool fixedPointIteration) final override
  { return pvi(getResultIterator<typename SubstitutionTree::template Iterator<RetrievalAlgorithms::UnificationWithAbstraction<AbstractingUnifier, RetrievalAlgorithms::DefaultVarBanks>>>(t, /* retrieveSubstitutions */ true, AbstractingUnifier::empty(AbstractionOracle(uwa)), AbstractionOracle(uwa), fixedPointIteration)); }